

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O0

pair<RenX::LadderDatabase::Entry_*,_unsigned_long> __thiscall
RenX::LadderDatabase::getPlayerEntryAndIndex(LadderDatabase *this,uint64_t steamid)

{
  unsigned_long local_48;
  void *local_40;
  Entry *local_38;
  Entry *itr;
  size_t index;
  uint64_t steamid_local;
  LadderDatabase *this_local;
  
  itr = (Entry *)0x0;
  local_38 = this->m_head;
  while( true ) {
    index = steamid;
    steamid_local = (uint64_t)this;
    if (local_38 == (Entry *)0x0) {
      local_40 = (void *)0x0;
      local_48 = 0xffffffffffffffff;
      std::pair<RenX::LadderDatabase::Entry_*,_unsigned_long>::
      pair<std::nullptr_t,_unsigned_long,_true>
                ((pair<RenX::LadderDatabase::Entry_*,_unsigned_long> *)&this_local,&local_40,
                 &local_48);
      return _this_local;
    }
    if (local_38->steam_id == steamid) break;
    local_38 = local_38->next;
    itr = (Entry *)((long)&itr->rank + 1);
  }
  std::pair<RenX::LadderDatabase::Entry_*,_unsigned_long>::
  pair<RenX::LadderDatabase::Entry_*&,_unsigned_long_&,_true>
            ((pair<RenX::LadderDatabase::Entry_*,_unsigned_long> *)&this_local,&local_38,
             (unsigned_long *)&itr);
  return _this_local;
}

Assistant:

std::pair<RenX::LadderDatabase::Entry *, size_t> RenX::LadderDatabase::getPlayerEntryAndIndex(uint64_t steamid) const {
	size_t index = 0;
	for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
		if (itr->steam_id == steamid) {
			return std::pair<Entry*, size_t>(itr, index);
		}
	}
	return std::pair<Entry*, size_t>(nullptr, SIZE_MAX);
}